

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O1

void __thiscall Employee::Employee(Employee *this,Employee *employee)

{
  bool bVar1;
  
  Person::Person(&this->super_Person,&employee->super_Person);
  (this->super_Person)._vptr_Person = (_func_int **)&PTR_validate_0010bd30;
  this->hourWork = employee->hourWork;
  this->salaryPerHour = employee->salaryPerHour;
  this->workToDo = employee->workToDo;
  this->workDone = employee->workDone;
  if ((this->super_Person).id._M_dataplus._M_p[2] == '*') {
    bVar1 = Person::validate(&this->super_Person);
    if (bVar1) {
      return;
    }
  }
  std::operator<<((ostream *)&std::cout,"invalid id");
  exit(1);
}

Assistant:

Employee::Employee(const Employee &employee) : Person(employee) {
    hourWork = employee.hourWork;
    salaryPerHour = employee.salaryPerHour;
    workToDo = employee.workToDo;
    workDone = employee.workDone;
    if(!validate())
    {cout<<"invalid id";
        exit(1);
    }

}